

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSurfacelessContextTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::anon_unknown_0::SurfacelessContextCase::executeForConfig
          (SurfacelessContextCase *this,EGLDisplay display,EGLConfig config)

{
  ostringstream *this_00;
  ostringstream *this_01;
  TestLog *pTVar1;
  bool bVar2;
  EGLint EVar3;
  uint uVar4;
  deUint32 dVar5;
  int iVar6;
  Library *egl;
  size_t sVar7;
  undefined4 extraout_var;
  char *pcVar8;
  NotSupportedError *this_02;
  long lVar9;
  UniqueContext context;
  Hex<16UL> local_1d0;
  UniqueContext local_1c8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  egl = EglTestContext::getLibrary((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  pTVar1 = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
           m_log;
  EVar3 = eglu::getConfigAttribInt(egl,display,config,0x3028);
  uVar4 = eglu::getConfigAttribInt(egl,display,config,0x3040);
  local_1b0._0_8_ = local_1b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b0,"EGL_KHR_surfaceless_context","");
  bVar2 = eglu::hasExtension(egl,display,(string *)local_1b0);
  if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
    operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
  }
  if (!bVar2) {
    this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_02,"EGL_KHR_surfaceless_context not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSurfacelessContextTests.cpp"
               ,100);
    __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  this_00 = (ostringstream *)(local_1b0 + 8);
  lVar9 = 0;
  do {
    if ((*(uint *)((long)&executeForConfig::apis[0].apiBit + lVar9) & uVar4) != 0) {
      local_1b0._0_8_ = pTVar1;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Creating ",9);
      pcVar8 = *(char **)((long)&executeForConfig::apis[0].name + lVar9);
      if (pcVar8 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(local_1b0._8_8_ - 0x18) + (int)this_00);
      }
      else {
        sVar7 = strlen(pcVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar8,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00," context with config ID ",0x18);
      std::ostream::operator<<(this_00,EVar3);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_138);
      (**egl->_vptr_Library)(egl,(ulong)*(uint *)((long)&executeForConfig::apis[0].api + lVar9));
      dVar5 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar5,"bindAPI(apis[apiNdx].api)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSurfacelessContextTests.cpp"
                       ,0x6d);
      iVar6 = (*egl->_vptr_Library[6])
                        (egl,display,config,0,
                         *(undefined8 *)((long)&executeForConfig::apis[0].ctxAttrs + lVar9));
      eglu::UniqueContext::UniqueContext
                (&local_1c8,egl,display,(EGLContext)CONCAT44(extraout_var,iVar6));
      dVar5 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar5,"eglCreateContext()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSurfacelessContextTests.cpp"
                       ,0x70);
      iVar6 = (*egl->_vptr_Library[0x27])(egl,display,0,0,local_1c8.m_context);
      if (iVar6 == 0) {
        iVar6 = (*egl->_vptr_Library[0x1f])(egl);
        if (iVar6 == 0x3009) {
          local_1b0._0_8_ = pTVar1;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b0 + 8),
                     "  eglMakeCurrent() failed with EGL_BAD_MATCH. Context doesn\'t support surfaceless mode."
                     ,0x57);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_00201c68;
        }
        this_01 = (ostringstream *)(local_1b0 + 8);
        local_1b0._0_8_ = pTVar1;
        std::__cxx11::ostringstream::ostringstream(this_01);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_01,"  Fail, context: ",0x11);
        local_1d0.value = (deUint64)local_1c8.m_context;
        tcu::Format::Hex<16UL>::toStream(&local_1d0,(ostream *)this_01);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,", error: ",9);
        pcVar8 = eglu::getErrorName(iVar6);
        if (pcVar8 == (char *)0x0) {
          std::ios::clear((int)local_1b0 + 8 + (int)*(undefined8 *)(local_1b0._8_8_ - 0x18));
        }
        else {
          sVar7 = strlen(pcVar8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b0 + 8),pcVar8,sVar7);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
        std::ios_base::~ios_base(local_138);
        tcu::TestContext::setTestResult
                  ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_FAIL,"Failed to make context current");
      }
      else {
        (*egl->_vptr_Library[0x27])(egl,display,0,0,0);
        dVar5 = (*egl->_vptr_Library[0x1f])(egl);
        eglu::checkError(dVar5,
                         "makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSurfacelessContextTests.cpp"
                         ,0x83);
        local_1b0._0_8_ = pTVar1;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 8),"  Pass",6);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00201c68:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
        std::ios_base::~ios_base(local_138);
      }
      eglu::UniqueContext::~UniqueContext(&local_1c8);
    }
    lVar9 = lVar9 + 0x18;
    if (lVar9 == 0x78) {
      return;
    }
  } while( true );
}

Assistant:

void SurfacelessContextCase::executeForConfig (EGLDisplay display, EGLConfig config)
{
	const Library&	egl		= m_eglTestCtx.getLibrary();
	TestLog&		log		= m_testCtx.getLog();
	const EGLint	id		= eglu::getConfigAttribInt(egl, display, config, EGL_CONFIG_ID);
	const EGLint	apiBits	= eglu::getConfigAttribInt(egl, display, config, EGL_RENDERABLE_TYPE);

	static const EGLint es1Attrs[] = { EGL_CONTEXT_CLIENT_VERSION,		1, EGL_NONE };
	static const EGLint es2Attrs[] = { EGL_CONTEXT_CLIENT_VERSION,		2, EGL_NONE };
	static const EGLint es3Attrs[] = { EGL_CONTEXT_MAJOR_VERSION_KHR,	3, EGL_NONE };

	static const struct
	{
		const char*		name;
		EGLenum			api;
		EGLint			apiBit;
		const EGLint*	ctxAttrs;
	} apis[] =
	{
		{ "OpenGL",			EGL_OPENGL_API,		EGL_OPENGL_BIT,			DE_NULL		},
		{ "OpenGL ES 1",	EGL_OPENGL_ES_API,	EGL_OPENGL_ES_BIT,		es1Attrs	},
		{ "OpenGL ES 2",	EGL_OPENGL_ES_API,	EGL_OPENGL_ES2_BIT,		es2Attrs	},
		{ "OpenGL ES 3",	EGL_OPENGL_ES_API,	EGL_OPENGL_ES3_BIT_KHR,	es3Attrs	},
		{ "OpenVG",			EGL_OPENVG_API,		EGL_OPENVG_BIT,			DE_NULL		}
	};

	if (!eglu::hasExtension(egl, display, "EGL_KHR_surfaceless_context"))
		TCU_THROW(NotSupportedError, "EGL_KHR_surfaceless_context not supported");

	for (int apiNdx = 0; apiNdx < (int)DE_LENGTH_OF_ARRAY(apis); apiNdx++)
	{
		if ((apiBits & apis[apiNdx].apiBit) == 0)
			continue; // Not supported API

		log << TestLog::Message << "Creating " << apis[apiNdx].name << " context with config ID " << id << TestLog::EndMessage;

		EGLU_CHECK_CALL(egl, bindAPI(apis[apiNdx].api));

		eglu::UniqueContext context(egl, display, egl.createContext(display, config, EGL_NO_CONTEXT, apis[apiNdx].ctxAttrs));
		EGLU_CHECK_MSG(egl, "eglCreateContext()");

		if (!egl.makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, *context))
		{
			const EGLenum err = egl.getError();

			if (err == EGL_BAD_MATCH)
			{
				log << TestLog::Message << "  eglMakeCurrent() failed with EGL_BAD_MATCH. Context doesn't support surfaceless mode." << TestLog::EndMessage;
				continue;
			}
			else
			{
				log << TestLog::Message << "  Fail, context: " << tcu::toHex(*context) << ", error: " << eglu::getErrorName(err) << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to make context current");
				continue;
			}
		}

		EGLU_CHECK_CALL(egl, makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));

		log << TestLog::Message << "  Pass" << TestLog::EndMessage;
	}
}